

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O1

void __thiscall QAccessibleTable::QAccessibleTable(QAccessibleTable *this,QWidget *w)

{
  QAccessibleObject *this_00;
  long lVar1;
  
  *(code **)this = QPainter::drawPath;
  *(code **)&this->super_QAccessibleSelectionInterface = QTextCursor::hasComplexSelection;
  this_00 = &this->super_QAccessibleObject;
  QAccessibleObject::QAccessibleObject(this_00,&w->super_QObject);
  *(undefined ***)this = &PTR__QAccessibleTable_00818208;
  *(undefined ***)&this->super_QAccessibleSelectionInterface = &PTR__QAccessibleTable_00818360;
  *(undefined ***)&this->super_QAccessibleObject = &PTR__QAccessibleTable_008183c0;
  (this->childToId).d = (Data *)0x0;
  QAccessibleObject::object();
  QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  lVar1 = QMetaObject::cast((QObject *)&QTableView::staticMetaObject);
  if (lVar1 == 0) {
    (**(code **)(*(long *)this_00 + 0x18))(this_00);
    QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
    lVar1 = QMetaObject::cast((QObject *)&QTreeView::staticMetaObject);
    if (lVar1 != 0) {
      this->m_role = Tree;
      return;
    }
    (**(code **)(*(long *)&this->super_QAccessibleObject + 0x18))(this_00);
    QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
    lVar1 = QMetaObject::cast((QObject *)&QListView::staticMetaObject);
    if (lVar1 != 0) {
      this->m_role = List;
      return;
    }
  }
  this->m_role = Table;
  return;
}

Assistant:

QAccessibleTable::QAccessibleTable(QWidget *w)
    : QAccessibleObject(w)
{
    Q_ASSERT(view());

#if QT_CONFIG(tableview)
    if (qobject_cast<const QTableView*>(view())) {
        m_role = QAccessible::Table;
    } else
#endif
#if QT_CONFIG(treeview)
    if (qobject_cast<const QTreeView*>(view())) {
        m_role = QAccessible::Tree;
    } else
#endif
#if QT_CONFIG(listview)
    if (qobject_cast<const QListView*>(view())) {
        m_role = QAccessible::List;
    } else
#endif
    {
        // is this our best guess?
        m_role = QAccessible::Table;
    }
}